

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  undefined1 uVar1;
  bool bVar2;
  ulong uVar3;
  string *psVar4;
  char *extension;
  UnitTest *__s;
  allocator<char> *__a;
  string *in_RDI;
  FilePath result;
  FilePath output_name;
  char *colon;
  string format;
  char *gtest_output_flag;
  FilePath *in_stack_fffffffffffffce8;
  FilePath *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  allocator<char> *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  FilePath *base_name;
  FilePath *in_stack_fffffffffffffd48;
  string *relative_path;
  FilePath *in_stack_fffffffffffffd88;
  FilePath local_238;
  allocator<char> local_211;
  string local_210 [71];
  allocator<char> local_1c9;
  string local_1c8 [8];
  char *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  FilePath *in_stack_fffffffffffffe50;
  FilePath *in_stack_fffffffffffffe58;
  undefined1 local_161 [33];
  FilePath local_140;
  undefined4 local_120;
  allocator<char> local_119;
  string local_118 [71];
  allocator<char> local_d1;
  string local_d0 [64];
  FilePath local_90;
  char *local_70;
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [32];
  char *local_10;
  
  relative_path = in_RDI;
  local_10 = (char *)std::__cxx11::string::c_str();
  GetOutputFormat_abi_cxx11_();
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    std::__cxx11::string::operator=(local_30,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  local_70 = strchr(local_10,0x3a);
  if (local_70 == (char *)0x0) {
    UnitTest::GetInstance();
    UnitTest::original_working_dir((UnitTest *)0x168d78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    FilePath::FilePath((FilePath *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcf8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    FilePath::FilePath((FilePath *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcf8);
    std::__cxx11::string::c_str();
    FilePath::MakeFileName
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
               in_stack_fffffffffffffe40);
    psVar4 = FilePath::string_abi_cxx11_(&local_90);
    std::__cxx11::string::string((string *)in_RDI,(string *)psVar4);
    FilePath::~FilePath((FilePath *)0x168e6b);
    FilePath::~FilePath((FilePath *)0x168e78);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
    FilePath::~FilePath((FilePath *)0x168e9f);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    local_120 = 1;
  }
  else {
    extension = local_70 + 1;
    base_name = (FilePath *)local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    FilePath::FilePath((FilePath *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcf8);
    std::__cxx11::string::~string((string *)(local_161 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_161);
    uVar1 = FilePath::IsAbsolutePath(in_stack_fffffffffffffcf0);
    if (!(bool)uVar1) {
      __s = UnitTest::GetInstance();
      __a = (allocator<char> *)UnitTest::original_working_dir((UnitTest *)0x16906d);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffd30),(char *)__s,__a);
      FilePath::FilePath((FilePath *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         in_stack_fffffffffffffcf8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffd30),(char *)__s,__a);
      FilePath::FilePath((FilePath *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         in_stack_fffffffffffffcf8);
      FilePath::ConcatPaths(in_stack_fffffffffffffd88,(FilePath *)relative_path);
      FilePath::operator=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      FilePath::~FilePath((FilePath *)0x16914b);
      FilePath::~FilePath((FilePath *)0x169158);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator(&local_211);
      FilePath::~FilePath((FilePath *)0x16917f);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
    }
    bVar2 = FilePath::IsDirectory
                      ((FilePath *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    if (bVar2) {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      std::__cxx11::string::c_str();
      FilePath::GenerateUniqueFileName(in_stack_fffffffffffffd48,base_name,extension);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd88);
      FilePath::~FilePath((FilePath *)0x1693a4);
      psVar4 = FilePath::string_abi_cxx11_(&local_238);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar4);
      local_120 = 1;
      FilePath::~FilePath((FilePath *)0x1693e4);
    }
    else {
      psVar4 = FilePath::string_abi_cxx11_(&local_140);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar4);
      local_120 = 1;
    }
    FilePath::~FilePath((FilePath *)0x16945c);
  }
  std::__cxx11::string::~string(local_30);
  return relative_path;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();

  std::string format = GetOutputFormat();
  if (format.empty())
    format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile), 0,
        format.c_str()).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}